

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O3

void rtmidi_in_set_callback(RtMidiInPtr device,RtMidiCCallback callback,void *userData)

{
  undefined8 *userData_00;
  
  userData_00 = (undefined8 *)operator_new(0x10);
  *userData_00 = callback;
  userData_00[1] = userData;
  device->data = userData_00;
  MidiInApi::setCallback(*(MidiInApi **)((long)device->ptr + 8),callback_proxy,userData_00);
  return;
}

Assistant:

void rtmidi_in_set_callback (RtMidiInPtr device, RtMidiCCallback callback, void *userData)
{
    device->data = (void*) new CallbackProxyUserData (callback, userData);
    try {
        ((RtMidiIn*) device->ptr)->setCallback (callback_proxy, device->data);
    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        delete (CallbackProxyUserData*) device->data;
        device->data = 0;
    }
}